

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_locale.cpp
# Opt level: O0

char * __thiscall
ON_Locale::GetAppleLanguageName(ON_Locale *this,char *buffer,size_t buffer_capacity)

{
  bool bVar1;
  char *pcVar2;
  char *local_58;
  char *local_50;
  char *local_40;
  char *script_subtag;
  char *s;
  char *buffer_end;
  size_t buffer_capacity_local;
  char *buffer_local;
  ON_Locale *this_local;
  
  pcVar2 = LocaleStringBuilderDestEnd(buffer,buffer_capacity);
  script_subtag = LocaleStringBuilder('\0',this->m_language_subtag,9,buffer,pcVar2);
  bVar1 = ON_String::EqualOrdinal("zh",3,buffer,3,true);
  if ((bVar1) || (this->m_region_subtag[0] != '\0')) {
    if (this->m_script_subtag[0] == '\0') {
      local_40 = (char *)0x0;
      bVar1 = ON_String::EqualOrdinal("CN",-1,this->m_region_subtag,-1,true);
      if (bVar1) {
        local_40 = "Hans";
      }
      else {
        bVar1 = ON_String::EqualOrdinal("TW",-1,this->m_region_subtag,-1,true);
        if (bVar1) {
          local_40 = "Hant";
        }
      }
      if (local_40 != (char *)0x0) {
        pcVar2 = LocaleStringBuilder('-',local_40,5,script_subtag,pcVar2);
        local_50 = buffer;
        if (pcVar2 == (char *)0x0) {
          local_50 = (char *)0x0;
        }
        return local_50;
      }
    }
    script_subtag = LocaleStringBuilder('-',this->m_script_subtag,5,script_subtag,pcVar2);
  }
  pcVar2 = LocaleStringBuilder('-',this->m_region_subtag,5,script_subtag,pcVar2);
  local_58 = buffer;
  if (pcVar2 == (char *)0x0) {
    local_58 = (char *)0x0;
  }
  return local_58;
}

Assistant:

const char* ON_Locale::GetAppleLanguageName(
  char* buffer,
  size_t buffer_capacity
  ) const
{
  char* buffer_end = LocaleStringBuilderDestEnd(buffer,buffer_capacity);
  char* s = buffer;
  s = LocaleStringBuilder(ON_LOCALE_SUBTAG(0,m_language_subtag),s,buffer_end);
  if ( ON_String::EqualOrdinal("zh", 3, buffer, 3, true) || 0 != m_region_subtag[0] )
  {
    // Apple "language" names use "zh-Hans" for "zh-CN" and "zh-Hant" for "zh-TW"
    if ( 0 == m_script_subtag[0] )
    {
      const char* script_subtag = nullptr;
      if ( ON_String::EqualOrdinal("CN", -1, m_region_subtag, -1, true))
        script_subtag = "Hans";
      else if (ON_String::EqualOrdinal("TW", -1, m_region_subtag, -1, true))
        script_subtag = "Hant";
      if (0 != script_subtag)
      {
        s = LocaleStringBuilder('-', script_subtag, 5, s, buffer_end);
        return (nullptr == s) ? nullptr : buffer;
      }
    }
    s = LocaleStringBuilder(ON_LOCALE_SUBTAG('-', m_script_subtag), s, buffer_end);
  }
  s = LocaleStringBuilder(ON_LOCALE_SUBTAG('-', m_region_subtag), s, buffer_end);
  return ( nullptr == s ) ? nullptr : buffer;
}